

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2c0f7::ParseDummyCommand::configureAttribute
          (ParseDummyCommand *this,ConfigureContext *param_1,StringRef name,
          ArrayRef<llvm::StringRef> values)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  string local_a0;
  iterator local_80;
  StringRef *value;
  iterator __end3;
  iterator __begin3;
  ArrayRef<llvm::StringRef> *__range3;
  undefined1 local_58 [7];
  bool first;
  ConfigureContext *local_38;
  ConfigureContext *param_1_local;
  ParseDummyCommand *this_local;
  ArrayRef<llvm::StringRef> values_local;
  StringRef name_local;
  
  values_local.Data = (StringRef *)values.Length;
  this_local = (ParseDummyCommand *)values.Data;
  values_local.Length = (size_type)name.Data;
  local_38 = param_1;
  param_1_local = (ConfigureContext *)this;
  uVar1 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((uVar1 & 1) != 0) {
    llvm::StringRef::str_abi_cxx11_((string *)local_58,(StringRef *)&values_local.Length);
    uVar2 = std::__cxx11::string::c_str();
    printf("  -- \'%s\': [",uVar2);
    std::__cxx11::string::~string((string *)local_58);
    __range3._7_1_ = 1;
    __begin3 = (iterator)&this_local;
    __end3 = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)__begin3);
    value = llvm::ArrayRef<llvm::StringRef>::end((ArrayRef<llvm::StringRef> *)__begin3);
    for (; __end3 != value; __end3 = __end3 + 1) {
      local_80 = __end3;
      pcVar3 = ", ";
      if ((__range3._7_1_ & 1) != 0) {
        pcVar3 = "";
      }
      llvm::StringRef::str_abi_cxx11_(&local_a0,__end3);
      uVar2 = std::__cxx11::string::c_str();
      printf("%s\'%s\'",pcVar3,uVar2);
      std::__cxx11::string::~string((string *)&local_a0);
      __range3._7_1_ = 0;
    }
    printf("]\n");
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext&, StringRef name,
                                  ArrayRef<StringRef> values) override {
    if (delegate.shouldShowOutput()) {
      printf("  -- '%s': [", name.str().c_str());
      bool first = true;
      for (const auto& value: values) {
        printf("%s'%s'", first ? "" : ", ", value.str().c_str());
        first = false;
      }
      printf("]\n");
    }
    return true;
  }